

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

size_t __thiscall v_array<node_pred>::find_sorted(v_array<node_pred> *this,node_pred *ele)

{
  node_pred *pnVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pnVar1 = this->_begin;
  uVar5 = ((long)this->_end - (long)pnVar1 >> 3) * -0x5555555555555555;
  uVar2 = uVar5;
  if (uVar5 < 2) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar5 = uVar5 >> 1;
      uVar4 = uVar5;
      if ((ele->label <= pnVar1[uVar5].label) &&
         (uVar2 = uVar5, uVar4 = uVar3, pnVar1[uVar5].label <= ele->label)) {
        return uVar5;
      }
      uVar5 = uVar2 + uVar4;
      uVar3 = uVar4;
    } while (1 < uVar2 - uVar4);
  }
  if ((this->_end != pnVar1) && (pnVar1[uVar4].label <= ele->label)) {
    if (pnVar1[uVar4].label == ele->label) {
      uVar2 = uVar4;
    }
    return uVar2;
  }
  return uVar4;
}

Assistant:

size_t find_sorted(const T& ele) const  // index of the smallest element >= ele, return true if element is in the
                                          // array
  {
    size_t size = _end - _begin;
    size_t a = 0;
    size_t b = size;
    size_t i = (a + b) / 2;

    while (b - a > 1)
    {
      if (_begin[i] < ele)  // if a = 0, size = 1, if in while we have b - a >= 1 the loop is infinite
        a = i;
      else if (_begin[i] > ele)
        b = i;
      else
        return i;

      i = (a + b) / 2;
    }

    if ((size == 0) || (_begin[a] > ele) || (_begin[a] == ele))  // pusta tablica, nie wchodzi w while
      return a;
    else  // size = 1, ele = 1, _begin[0] = 0
      return b;
  }